

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_AigerWriteUnsignedFile(FILE *pFile,uint x)

{
  undefined4 local_14;
  uchar ch;
  uint x_local;
  FILE *pFile_local;
  
  for (local_14 = x; (local_14 & 0xffffff80) != 0; local_14 = local_14 >> 7) {
    fputc((uint)((byte)local_14 & 0x7f | 0x80),(FILE *)pFile);
  }
  fputc(local_14 & 0xff,(FILE *)pFile);
  return;
}

Assistant:

static inline void Gia_AigerWriteUnsignedFile( FILE * pFile, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        fputc( ch, pFile );
        x >>= 7;
    }
    ch = x;
    fputc( ch, pFile );
}